

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::restart_election_timer(raft_server *this)

{
  ptr<delayed_task> *task;
  long *plVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var4;
  size_type sVar5;
  int iVar6;
  undefined8 uVar7;
  unique_lock<std::recursive_mutex> guard;
  undefined1 local_59;
  string local_58;
  timer_task_type local_2c;
  unique_lock<std::recursive_mutex> local_28;
  
  local_28._M_device = &this->lock_;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((((this->catching_up_)._M_base._M_i & 1U) == 0) && ((this->role_)._M_i != leader)) {
    if (((((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->election_timer_allowed_)._M_base._M_i & 1U) == 0) {
      LOCK();
      (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      election_timer_allowed_)._M_base._M_i = true;
      UNLOCK();
      plVar1 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar1 + 0x20))
                (plVar1,(this->state_).
                        super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    task = &this->election_task_;
    if ((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      local_2c = election_timer;
      local_58._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::timer_task<void>,std::allocator<nuraft::timer_task<void>>,std::function<void()>&,nuraft::timer_task_type>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,
                 (timer_task<void> **)&local_58,(allocator<nuraft::timer_task<void>_> *)&local_59,
                 &this->election_exec_,&local_2c);
      sVar5 = local_58._M_string_length;
      _Var4._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this_00 = (this->election_task_).
                super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var4._M_p;
      (this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
        }
      }
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar6 = (*peVar2->_vptr_logger[7])();
        if (5 < iVar6) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_(&local_58,"cancel existing timer");
          (*peVar2->_vptr_logger[8])
                    (peVar2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"restart_election_timer",0xb0,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
      }
      peVar3 = (this->scheduler_).
               super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if (peVar3 != (element_type *)0x0) {
        (*peVar3->_vptr_delayed_task_scheduler[3])(peVar3,task);
        LOCK();
        (((task->super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        cancelled_)._M_base._M_i = true;
        UNLOCK();
      }
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar6 = (*peVar2->_vptr_logger[7])();
      if (5 < iVar6) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_58,"re-schedule election timer");
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"restart_election_timer",0xb8,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
    }
    timer_helper::reset(&this->last_election_timer_reset_);
    if ((this->rand_timeout_).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar7 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
      _Unwind_Resume(uVar7);
    }
    iVar6 = (*(this->rand_timeout_)._M_invoker)((_Any_data *)&this->rand_timeout_);
    schedule_task(this,task,iVar6);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void raft_server::restart_election_timer() {
    // don't start the election timer while this server is still catching up the logs
    // or this server is the leader
    recur_lock(lock_);
    if (catching_up_ || role_ == srv_role::leader) {
        return;
    }

    // If election timer was not allowed, clear the flag.
    if (!state_->is_election_timer_allowed()) {
        state_->allow_election_timer(true);
        ctx_->state_mgr_->save_state(*state_);
    }

    if (election_task_) {
        p_tr("cancel existing timer");
        cancel_task(election_task_);
    } else {
        election_task_ = cs_new< timer_task<void> >
                               ( election_exec_,
                                 timer_task_type::election_timer );
    }

    p_tr("re-schedule election timer");
    last_election_timer_reset_.reset();

    schedule_task(election_task_, rand_timeout_());
}